

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O0

bool __thiscall
iDynTree::KinDynComputations::getLinearAngularMomentumJacobian
          (KinDynComputations *this,MatrixView<double> *linAngMomentumJacobian)

{
  index_type iVar1;
  long lVar2;
  MatrixView<double> *in_RSI;
  MatrixDynSize *in_RDI;
  bool bVar3;
  bool ok;
  MatrixView<double> *in_stack_00000238;
  KinDynComputationsPrivateAttributes *in_stack_00000240;
  MatrixView<double> *in_stack_00000368;
  KinDynComputationsPrivateAttributes *in_stack_00000370;
  MatrixView<double> *in_stack_fffffffffffffea8;
  Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>
  *in_stack_fffffffffffffeb0;
  MatrixView<double> *this_00;
  KinDynComputations *in_stack_fffffffffffffec0;
  uint in_stack_fffffffffffffee4;
  Index in_stack_fffffffffffffee8;
  Index in_stack_fffffffffffffef0;
  MatrixView<double> *in_stack_fffffffffffffef8;
  
  iVar1 = MatrixView<double>::rows(in_RSI);
  in_stack_fffffffffffffee4 = in_stack_fffffffffffffee4 & 0xffffff;
  if (iVar1 == 6) {
    in_stack_fffffffffffffec0 = (KinDynComputations *)MatrixView<double>::cols(in_RSI);
    lVar2 = iDynTree::Model::getNrOfDOFs();
    in_stack_fffffffffffffee4 =
         CONCAT13(in_stack_fffffffffffffec0 == (KinDynComputations *)(lVar2 + 6),
                  (int3)in_stack_fffffffffffffee4);
  }
  bVar3 = (char)(in_stack_fffffffffffffee4 >> 0x18) != '\0';
  if (bVar3) {
    computeRawMassMatrixAndTotalMomentum(in_stack_fffffffffffffec0);
    toEigen(in_RDI);
    iDynTree::Model::getNrOfDOFs();
    Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<0,0>>>::
    block<int,unsigned_long>
              ((DenseBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
                *)in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
               in_stack_fffffffffffffee4,(unsigned_long)in_RDI);
    toEigen(in_stack_fffffffffffffef8);
    Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<-1,-1>>::operator=
              (in_stack_fffffffffffffeb0,
               (DenseBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>_>
                *)in_stack_fffffffffffffea8);
    this_00 = *(MatrixView<double> **)(in_RDI + 8);
    MatrixView<double>::MatrixView(this_00,in_stack_fffffffffffffea8);
    KinDynComputationsPrivateAttributes::processOnRightSideMatrixExpectingBodyFixedModelVelocity
              (in_stack_00000370,in_stack_00000368);
    MatrixView<double>::MatrixView(this_00,in_stack_fffffffffffffea8);
    KinDynComputationsPrivateAttributes::processOnLeftSideBodyFixedBaseMomentumJacobian
              (in_stack_00000240,in_stack_00000238);
  }
  else {
    iDynTree::reportError
              ("KinDynComputations","getLinearAngularMomentumJacobian",
               "Wrong size in input linAngMomentumJacobian");
  }
  return bVar3;
}

Assistant:

bool KinDynComputations::getLinearAngularMomentumJacobian(MatrixView<double> linAngMomentumJacobian)
{
    bool ok = (linAngMomentumJacobian.rows() == 6)
        && (linAngMomentumJacobian.cols() == pimpl->m_robot_model.getNrOfDOFs() + 6);

    if( !ok )
    {
        reportError("KinDynComputations",
                    "getLinearAngularMomentumJacobian",
                    "Wrong size in input linAngMomentumJacobian");
        return false;
    }

    this->computeRawMassMatrixAndTotalMomentum();

    toEigen(linAngMomentumJacobian) = toEigen(pimpl->m_rawMassMatrix).block(0,0,6,6+pimpl->m_robot_model.getNrOfDOFs());

    // Handle the different representations
    pimpl->processOnRightSideMatrixExpectingBodyFixedModelVelocity(linAngMomentumJacobian);
    pimpl->processOnLeftSideBodyFixedBaseMomentumJacobian(linAngMomentumJacobian);

    return true;
}